

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cjson_add.c
# Opt level: O3

void cJSON_add_array_should_add_array(void)

{
  cJSON *object;
  cJSON *pcVar1;
  
  object = (cJSON *)(*global_hooks.allocate)(0x40);
  if (object != (cJSON *)0x0) {
    object->child = (cJSON *)0x0;
    *(undefined8 *)&object->type = 0;
    object->valuedouble = 0.0;
    object->string = (char *)0x0;
    object->valuestring = (char *)0x0;
    *(undefined8 *)&object->valueint = 0;
    object->next = (cJSON *)0x0;
    object->prev = (cJSON *)0x0;
    object->type = 0x40;
  }
  cJSON_AddArrayToObject(object,"array");
  pcVar1 = get_object_item(object,"array",1);
  if (pcVar1 == (cJSON *)0x0) {
    UnityFail(" Expected Non-NULL",0x18c);
  }
  UnityAssertEqualNumber((long)pcVar1->type,0x20,(char *)0x0,0x18d,UNITY_DISPLAY_STYLE_INT);
  cJSON_Delete(object);
  return;
}

Assistant:

static void cJSON_add_array_should_add_array(void)
{
    cJSON *root = cJSON_CreateObject();
    cJSON *array = NULL;

    cJSON_AddArrayToObject(root, "array");
    TEST_ASSERT_NOT_NULL(array = cJSON_GetObjectItemCaseSensitive(root, "array"));
    TEST_ASSERT_EQUAL_INT(array->type, cJSON_Array);

    cJSON_Delete(root);
}